

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  int local_3c;
  int local_38;
  int *piStack_30;
  int iNode;
  int *pPlace;
  int local_20;
  int fCompl;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                  ,0x1d8,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit0 < 2) {
    local_38 = iLit1;
    if (iLit0 != 0) {
      local_38 = Abc_LitNot(iLit1);
    }
    p_local._4_4_ = local_38;
  }
  else if (iLit1 < 2) {
    local_3c = iLit0;
    if (iLit1 != 0) {
      local_3c = Abc_LitNot(iLit0);
    }
    p_local._4_4_ = local_3c;
  }
  else if (iLit0 == iLit1) {
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_LitNot(iLit1);
    if (iLit0 == iVar1) {
      p_local._4_4_ = 1;
    }
    else {
      if ((p->nObjs & 0xffU) == 0) {
        iVar1 = Vec_IntSize(&p->vHTable);
        iVar2 = Gia_ManAndNum(p);
        if (iVar1 << 1 < iVar2) {
          Gia_ManHashResize(p);
        }
      }
      local_20 = iLit1;
      fCompl = iLit0;
      if (iLit0 < iLit1) {
        local_20 = iLit0;
        fCompl = iLit1;
      }
      iVar1 = Abc_LitIsCompl(fCompl);
      if (iVar1 != 0) {
        fCompl = Abc_LitNot(fCompl);
      }
      pPlace._4_4_ = (uint)(iVar1 != 0);
      iVar1 = Abc_LitIsCompl(local_20);
      if (iVar1 != 0) {
        local_20 = Abc_LitNot(local_20);
        pPlace._4_4_ = pPlace._4_4_ ^ 1;
      }
      piStack_30 = Gia_ManHashFind(p,fCompl,local_20,-1);
      if (*piStack_30 == 0) {
        p->nHashMiss = p->nHashMiss + 1;
        iVar1 = Vec_IntSize(&p->vHash);
        iVar2 = Vec_IntCap(&p->vHash);
        if (iVar1 < iVar2) {
          iVar1 = Gia_ManAppendXorReal(p,fCompl,local_20);
          iVar1 = Abc_Lit2Var(iVar1);
          *piStack_30 = iVar1;
        }
        else {
          iVar1 = Gia_ManAppendXorReal(p,fCompl,local_20);
          piStack_30 = Gia_ManHashFind(p,fCompl,local_20,-1);
          if (*piStack_30 != 0) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaHash.c"
                          ,0x1f7,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
          }
          iVar1 = Abc_Lit2Var(iVar1);
          *piStack_30 = iVar1;
        }
        p_local._4_4_ = Abc_Var2Lit(*piStack_30,pPlace._4_4_);
      }
      else {
        p->nHashHit = p->nHashHit + 1;
        p_local._4_4_ = Abc_Var2Lit(*piStack_30,pPlace._4_4_);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManHashXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLit0 < 2 )
        return iLit0 ? Abc_LitNot(iLit1) : iLit1;
    if ( iLit1 < 2 )
        return iLit1 ? Abc_LitNot(iLit0) : iLit0;
    if ( iLit0 == iLit1 )
        return 0;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 1;
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( iLit0 < iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    if ( Abc_LitIsCompl(iLit0) )
        iLit0 = Abc_LitNot(iLit0), fCompl ^= 1;
    if ( Abc_LitIsCompl(iLit1) )
        iLit1 = Abc_LitNot(iLit1), fCompl ^= 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendXorReal( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendXorReal( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}